

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O0

void __thiscall
QBenchmarkPerfEventsMeasurer::~QBenchmarkPerfEventsMeasurer(QBenchmarkPerfEventsMeasurer *this)

{
  bool bVar1;
  const_iterator o;
  int *piVar2;
  QBenchmarkMeasurerBase *in_RDI;
  long in_FS_OFFSET;
  int fd;
  add_const_t<QList<int>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<int> *in_stack_ffffffffffffffb0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QBenchmarkMeasurerBase = (_func_int **)&PTR__QBenchmarkPerfEventsMeasurer_001e6d48;
  local_10.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<int>::begin(in_stack_ffffffffffffffb0);
  o = QList<int>::end(in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = QList<int>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    piVar2 = QList<int>::const_iterator::operator*(&local_10);
    qt_safe_close((int)((ulong)piVar2 >> 0x20));
    QList<int>::const_iterator::operator++(&local_10);
  }
  QList<int>::~QList((QList<int> *)0x123aef);
  QBenchmarkMeasurerBase::~QBenchmarkMeasurerBase(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QBenchmarkPerfEventsMeasurer::~QBenchmarkPerfEventsMeasurer()
{
    for (int fd : std::as_const(fds))
        qt_safe_close(fd);
}